

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CommonCore::receiveAny
          (CommonCore *this,LocalFederateId federateID,InterfaceHandle *endpoint_id)

{
  string_view message;
  FederateStates FVar1;
  FederateState *pFVar2;
  undefined8 uVar3;
  BaseType *in_RCX;
  Message *in_RDI;
  FederateState *fed;
  nullptr_t in_stack_ffffffffffffff98;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_helics::Message_*,_false> this_00;
  undefined4 in_stack_ffffffffffffffb8;
  InterfaceHandle in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  CommonCore *in_stack_ffffffffffffffd8;
  
  this_00._M_head_impl = in_RDI;
  pFVar2 = getFederateAt(in_stack_ffffffffffffffd8,
                         (LocalFederateId)(BaseType)((ulong)in_RCX >> 0x20));
  if (pFVar2 == (FederateState *)0x0) {
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00._M_head_impl,
               (char *)in_RDI);
    message._M_len._4_4_ = in_stack_ffffffffffffffbc.hid;
    message._M_len._0_4_ = in_stack_ffffffffffffffb8;
    message._M_str = in_stack_ffffffffffffffc0;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_00._M_head_impl,message);
    __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  FVar1 = FederateState::getState((FederateState *)0x52dddd);
  if (FVar1 == CREATED) {
    memset(&stack0xffffffffffffffbc,0,4);
    InterfaceHandle::InterfaceHandle((InterfaceHandle *)&stack0xffffffffffffffbc);
    *in_RCX = in_stack_ffffffffffffffbc.hid;
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    FederateState::receiveAny((FederateState *)endpoint_id,(InterfaceHandle *)fed);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)this_00._M_head_impl;
}

Assistant:

std::unique_ptr<Message> CommonCore::receiveAny(LocalFederateId federateID,
                                                InterfaceHandle& endpoint_id)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (receiveAny)"));
    }
    if (fed->getState() == FederateStates::CREATED) {
        endpoint_id = InterfaceHandle();
        return nullptr;
    }
    return fed->receiveAny(endpoint_id);
}